

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O0

void __thiscall
density::
conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>_>
::put_transaction<int_(Struct::*)()>::put_transaction
          (put_transaction<int_(Struct::*)()> *this,PrivateType param_1,
          unique_lock<std::mutex> *i_lock,put_transaction<int_(Struct::*)()> *i_put_transaction)

{
  bool bVar1;
  put_transaction<int_(Struct::*)()> *i_put_transaction_local;
  unique_lock<std::mutex> *i_lock_local;
  PrivateType param_1_local;
  put_transaction<int_(Struct::*)()> *this_local;
  
  std::unique_lock<std::mutex>::unique_lock(&this->m_lock,i_lock);
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
  ::
  put_transaction<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*)()>
  ::
  put_transaction<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*)(),void>
            ((put_transaction<int(density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*)()>
              *)&this->m_put_transaction,i_put_transaction);
  bVar1 = density::heter_queue::put_transaction::operator_cast_to_bool
                    ((put_transaction *)&this->m_put_transaction);
  if (!bVar1) {
    std::unique_lock<std::mutex>::unlock(&this->m_lock);
  }
  return;
}

Assistant:

put_transaction(
              PrivateType,
              std::unique_lock<std::mutex> && i_lock,
              typename InnerQueue::template put_transaction<ELEMENT_COMPLETE_TYPE> &&
                i_put_transaction) noexcept
                : m_lock(std::move(i_lock)), m_put_transaction(std::move(i_put_transaction))
            {
                if (!m_put_transaction)
                    m_lock.unlock();
            }